

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonogram.cpp
# Opt level: O0

Board * __thiscall Nonogram::get_board(Nonogram *this,int index)

{
  size_type sVar1;
  const_reference pvVar2;
  int local_14;
  int index_local;
  Nonogram *this_local;
  
  local_14 = index;
  if (index < 0) {
    sVar1 = std::
            vector<std::pair<std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>,_std::allocator<std::pair<std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>_>_>
            ::size(&this->m_boards);
    local_14 = index + (int)sVar1;
  }
  pvVar2 = std::
           vector<std::pair<std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>,_std::allocator<std::pair<std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>_>_>
           ::operator[](&this->m_boards,(long)local_14);
  return pvVar2;
}

Assistant:

const Board &Nonogram::get_board(int index) const {
    if (index < 0) {
        index += m_boards.size();
    }
    return m_boards[index];
}